

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_test_interface.h
# Opt level: O0

void __thiscall
google::
HashtableInterface_SparseHashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::HashtableInterface_SparseHashtable<int_const*>
          (HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this,int *f,int *l,size_type expected_max_items,hasher *hf,key_equal *eql,
          allocator_type *alloc)

{
  allocator_type *in_RCX;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_RDI;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_R9;
  SetKey<int,_Negation<int>_> *in_stack_00000008;
  key_equal *in_stack_ffffffffffffffb8;
  hasher *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  
  BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::BaseHashtableInterface<Negation<int>,SetKey<int,Negation<int>>>
            (in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (Negation<int> *)in_RDI,in_stack_00000008,in_RCX);
  in_RDI->_vptr_BaseHashtableInterface =
       (_func_int **)&PTR__HashtableInterface_SparseHashtable_012fd3b8;
  BaseHashtableInterface<google::sparse_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::insert<int_const*>(in_RDI,(int *)in_stack_00000008,(int *)0xb1fc48);
  return;
}

Assistant:

HashtableInterface_SparseHashtable(
      InputIterator f, InputIterator l,
      typename p::size_type expected_max_items = 0,
      const typename p::hasher& hf = typename p::hasher(),
      const typename p::key_equal& eql = typename p::key_equal(),
      const typename p::allocator_type& alloc = typename p::allocator_type())
      : BaseHashtableInterface<ht>(expected_max_items, hf, eql, ExtractKey(),
                                   SetKey(), alloc) {
    this->insert(f, l);
  }